

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

int luaJIT_setmode(lua_State *L,int idx,int mode)

{
  int iVar1;
  int iVar2;
  undefined4 *puVar3;
  uint uVar4;
  ulong uVar5;
  GCstr *pGVar6;
  jit_State *pt_00;
  ulong *puVar7;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  cTValue *tv_1;
  GCproto *pt;
  cTValue *tv;
  int mm;
  global_State *g;
  uint32_t *segmap;
  uint64_t seg;
  uint64_t u;
  GCproto *in_stack_fffffffffffffef8;
  ErrMsg em;
  jit_State *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  jit_State *in_stack_ffffffffffffff10;
  lua_State *in_stack_ffffffffffffff20;
  global_State *in_stack_ffffffffffffff40;
  
  uVar5 = (ulong)*(uint *)(in_RDI + 8);
  uVar4 = in_EDX & 0xff;
  if (*(int *)(uVar5 + 400) != 0) {
    puVar3 = *(undefined4 **)(in_RDI + 0x18);
    *(undefined4 **)(in_RDI + 0x18) = puVar3 + 2;
    pGVar6 = lj_err_str((lua_State *)in_stack_ffffffffffffff10,
                        (ErrMsg)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    *puVar3 = (int)pGVar6;
    puVar3[1] = 0xfffffffb;
    if (*(long *)(uVar5 + 0x178) != 0) {
      (**(code **)(uVar5 + 0x178))(in_RDI);
    }
    exit(1);
  }
  *(uint *)(uVar5 + 0x31c) = *(uint *)(uVar5 + 0x31c) & 0xffffffef;
  em = (ErrMsg)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  if ((*(byte *)(uVar5 + 0x109) & 0x40) != 0) {
    lj_err_caller((lua_State *)in_stack_ffffffffffffff00,em);
  }
  switch(uVar4) {
  case 0:
    if ((in_EDX & 0x200) == 0) {
      if ((in_EDX & 0x100) == 0) {
        *(uint *)(uVar5 + 0x2d8) = *(uint *)(uVar5 + 0x2d8) & 0xfffffffe;
      }
      else {
        *(uint *)(uVar5 + 0x2d8) = *(uint *)(uVar5 + 0x2d8) | 1;
      }
      lj_dispatch_update(in_stack_ffffffffffffff40);
    }
    else {
      lj_trace_flushall(in_stack_ffffffffffffff20);
    }
    break;
  default:
    return 0;
  case 2:
  case 3:
  case 4:
    if (in_ESI == 0) {
      if ((*(uint *)(*(long *)(in_RDI + 0x10) + -4) & 3) == 0) {
        pt_00 = (jit_State *)
                (*(long *)(in_RDI + 0x10) + -8 +
                (ulong)((*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -4) - 4) >> 8 & 0xff)
                       + 1) * -8);
        in_stack_ffffffffffffff10 = pt_00;
      }
      else {
        pt_00 = (jit_State *)
                ((*(long *)(in_RDI + 0x10) + -8) -
                ((long)*(int *)(*(long *)(in_RDI + 0x10) + -4) & 0xfffffffffffffff8U));
        in_stack_ffffffffffffff10 = pt_00;
      }
    }
    else if (in_ESI < 1) {
      in_stack_ffffffffffffff00 = (jit_State *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * 8);
      pt_00 = in_stack_ffffffffffffff00;
    }
    else {
      in_stack_ffffffffffffff00 = (jit_State *)(*(long *)(in_RDI + 0x10) + (long)(in_ESI + -1) * 8);
      pt_00 = in_stack_ffffffffffffff00;
    }
    if ((((in_ESI != 0) &&
         (iVar1._0_1_ = (pt_00->cur).marked, iVar1._1_1_ = (pt_00->cur).gct,
         iVar1._2_2_ = (pt_00->cur).nsnap, iVar1 != -9)) ||
        (*(char *)((ulong)(pt_00->cur).nextgc.gcptr32 + 6) != '\0')) &&
       (iVar2._0_1_ = (pt_00->cur).marked, iVar2._1_1_ = (pt_00->cur).gct,
       iVar2._2_2_ = (pt_00->cur).nsnap, iVar2 != -8)) {
      return 0;
    }
    if (uVar4 != 4) {
      setptmode((global_State *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0);
    }
    if (uVar4 != 2) {
      setptmode_all((global_State *)in_stack_ffffffffffffff10,(GCproto *)pt_00,
                    (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    }
    break;
  case 5:
    if ((in_EDX & 0x200) == 0) {
      return 0;
    }
    lj_trace_flush(in_stack_ffffffffffffff00,em);
    break;
  case 0x10:
    if ((in_EDX & 0x100) == 0) {
      *(undefined4 *)(uVar5 + 0x184) = 0x5f;
    }
    else {
      if (in_ESI == 0) {
        return 0;
      }
      if (in_ESI < 1) {
        puVar7 = (ulong *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * 8);
      }
      else {
        puVar7 = (ulong *)(*(long *)(in_RDI + 0x10) + (long)(in_ESI + -1) * 8);
      }
      if (*(int *)((long)puVar7 + 4) >> 0xf != -2) {
        return 0;
      }
      *(ulong *)(uVar5 + 0x170) =
           (ulong)*(uint *)((ulong)*(uint *)(uVar5 + 0x88) + (*puVar7 >> 0x27 & 0xff) * 4) << 0x20 |
           *puVar7 & 0x7fffffffff;
      *(undefined4 *)(uVar5 + 0x184) = 0x60;
    }
  }
  return 1;
}

Assistant:

int luaJIT_setmode(lua_State *L, int idx, int mode)
{
  global_State *g = G(L);
  int mm = mode & LUAJIT_MODE_MASK;
  /* Forbid JIT state change while running the trace */
  if (tvref(g->jit_base)) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITMODE));
    if (g->panic) g->panic(L);
    exit(EXIT_FAILURE);
  }
  lj_trace_abort(g);  /* Abort recording on any state change. */
  /* Avoid pulling the rug from under our own feet. */
  if ((g->hookmask & HOOK_GC))
    lj_err_caller(L, LJ_ERR_NOGCMM);
  switch (mm) {
#if LJ_HASJIT
  case LUAJIT_MODE_ENGINE:
    if ((mode & LUAJIT_MODE_FLUSH)) {
      lj_trace_flushall(L);
    } else {
      if (!(mode & LUAJIT_MODE_ON))
	G2J(g)->flags &= ~(uint32_t)JIT_F_ON;
      else
	G2J(g)->flags |= (uint32_t)JIT_F_ON;
      lj_dispatch_update(g);
    }
    break;
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC: {
    cTValue *tv = idx == 0 ? frame_prev(L->base-1)-LJ_FR2 :
		  idx > 0 ? L->base + (idx-1) : L->top + idx;
    GCproto *pt;
    if ((idx == 0 || tvisfunc(tv)) && isluafunc(&gcval(tv)->fn))
      pt = funcproto(&gcval(tv)->fn);  /* Cannot use funcV() for frame slot. */
    else if (tvisproto(tv))
      pt = protoV(tv);
    else
      return 0;  /* Failed. */
    if (mm != LUAJIT_MODE_ALLSUBFUNC)
      setptmode(g, pt, mode);
    if (mm != LUAJIT_MODE_FUNC)
      setptmode_all(g, pt, mode);
    break;
    }
  case LUAJIT_MODE_TRACE:
    if (!(mode & LUAJIT_MODE_FLUSH))
      return 0;  /* Failed. */
    lj_trace_flush(G2J(g), idx);
    break;
#else
  case LUAJIT_MODE_ENGINE:
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC:
    UNUSED(idx);
    if ((mode & LUAJIT_MODE_ON))
      return 0;  /* Failed. */
    break;
#endif
  case LUAJIT_MODE_WRAPCFUNC:
    if ((mode & LUAJIT_MODE_ON)) {
      if (idx != 0) {
	cTValue *tv = idx > 0 ? L->base + (idx-1) : L->top + idx;
	if (tvislightud(tv))
	  g->wrapf = (lua_CFunction)lightudV(g, tv);
	else
	  return 0;  /* Failed. */
      } else {
	return 0;  /* Failed. */
      }
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCCW, 0, 0);
    } else {
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCC, 0, 0);
    }
    break;
  default:
    return 0;  /* Failed. */
  }
  return 1;  /* OK. */
}